

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O0

void trimCodes(string *code,string *qual,int overlap,int *rightNonOverlapGCCount,
              bool hasRightOverlap)

{
  string *psVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  difference_type dVar6;
  difference_type dVar7;
  int *in_RCX;
  int in_EDX;
  string *in_RSI;
  string *in_RDI;
  byte in_R8B;
  int noCs;
  int noOs;
  string rightNonOverlap;
  string returnQual;
  string returnCode;
  int distance;
  string prevCount;
  int i;
  size_t *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe50;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  int local_60;
  allocator local_49;
  string local_48 [32];
  int local_28;
  byte local_21;
  int *local_20;
  int local_14;
  string *local_10;
  string *local_8;
  
  local_21 = in_R8B & 1;
  local_28 = 0;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"0",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_60 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"",&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"",&local_d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  do {
    uVar3 = (ulong)local_28;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= uVar3) {
LAB_0026f254:
      std::__cxx11::string::operator=(local_8,local_80);
      std::__cxx11::string::operator=(local_10,local_a8);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_48);
      return;
    }
    pcVar5 = (char *)std::__cxx11::string::at((ulong)local_8);
    if ((*pcVar5 == 'O') ||
       (pcVar5 = (char *)std::__cxx11::string::at((ulong)local_8), *pcVar5 == 'C')) {
      iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0);
      psVar1 = local_8;
      local_60 = iVar2 + local_60 + 2;
      if (local_14 <= local_60) {
        if ((local_21 & 1) != 0) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_f8,(ulong)psVar1);
          std::__cxx11::string::operator=(local_d0,local_f8);
          std::__cxx11::string::~string(local_f8);
          std::__cxx11::string::begin();
          std::__cxx11::string::end();
          dVar6 = std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                             (char *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
          std::__cxx11::string::begin();
          std::__cxx11::string::end();
          dVar7 = std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                             (char *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
          *local_20 = (int)dVar6 + (int)dVar7;
        }
        goto LAB_0026f254;
      }
      std::__cxx11::string::operator+=(local_80,local_48);
      in_stack_fffffffffffffe50._M_current = (char *)std::__cxx11::string::at((ulong)local_8);
      std::__cxx11::string::operator+=(local_80,*in_stack_fffffffffffffe50._M_current);
      std::__cxx11::string::operator+=(local_a8,local_48);
      in_stack_fffffffffffffe48._M_current = (char *)std::__cxx11::string::at((ulong)local_10);
      std::__cxx11::string::operator+=(local_a8,*in_stack_fffffffffffffe48._M_current);
      std::__cxx11::string::operator=(local_48,"0");
    }
    else {
      in_stack_fffffffffffffe47 =
           std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      if ((bool)in_stack_fffffffffffffe47) {
        pcVar5 = (char *)std::__cxx11::string::at((ulong)local_8);
        std::__cxx11::string::operator=(local_48,*pcVar5);
      }
      else {
        in_stack_fffffffffffffe30 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::at((ulong)local_8);
        std::__cxx11::string::operator+=(local_48,(char)in_stack_fffffffffffffe30->_M_dataplus);
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void trimCodes(string & code, string & qual, int overlap, int & rightNonOverlapGCCount, bool hasRightOverlap){

    int i = 0;
    string prevCount="0";
    int distance = 0;
    string returnCode = "";
    string returnQual = "";
    string rightNonOverlap = "";
    while(i<code.size()){
        if(code.at(i)=='O' || code.at(i)=='C'){
            distance += stoi(prevCount);
            distance += 2;
            if(distance>=overlap){
                if(hasRightOverlap){
                    rightNonOverlap = code.substr(i,(code.size()-i));
                    int noOs= std::count(rightNonOverlap.begin(), rightNonOverlap.end(), 'O');
                    int noCs= std::count(rightNonOverlap.begin(), rightNonOverlap.end(), 'C');
                    rightNonOverlapGCCount = noOs + noCs;
                }
                break;
            }
            returnCode += prevCount;
            returnCode += code.at(i);
            returnQual += prevCount;
            returnQual += qual.at(i);
            prevCount = "0";
        }else{
            if(prevCount=="0"){
                prevCount = code.at(i);
            }else{
                prevCount += code.at(i);
            }
        }
        i++;
    }
    code = returnCode;
    qual = returnQual;
}